

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O2

void __thiscall
HSimplexNla::transformForUpdate
          (HSimplexNla *this,HVector *aq,HVector *ep,HighsInt variable_in,HighsInt row_out)

{
  pointer pdVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  allocator local_79;
  double local_78;
  string local_70;
  string local_50;
  
  if (this->scale_ != (HighsScale *)0x0) {
    std::__cxx11::string::string((string *)&local_50,"pack aq Bf ",&local_79);
    uVar3 = 0;
    reportPackValue(this,&local_50,aq,false);
    std::__cxx11::string::~string((string *)&local_50);
    local_78 = variableScaleFactor(this,variable_in);
    uVar2 = (ulong)(uint)aq->packCount;
    if (aq->packCount < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      pdVar1 = (aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1[uVar3] = pdVar1[uVar3] * local_78;
    }
    std::__cxx11::string::string((string *)&local_70,"pack aq Af ",&local_79);
    uVar3 = 0;
    reportPackValue(this,&local_70,aq,false);
    std::__cxx11::string::~string((string *)&local_70);
    pdVar1 = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_78 = local_78 * pdVar1[row_out];
    pdVar1[row_out] = local_78;
    dVar4 = basicColScaleFactor(this,row_out);
    pdVar1[row_out] = local_78 / dVar4;
    uVar2 = (ulong)(uint)ep->packCount;
    if (ep->packCount < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      pdVar1 = (ep->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1[uVar3] = pdVar1[uVar3] / dVar4;
    }
  }
  return;
}

Assistant:

void HSimplexNla::transformForUpdate(HVector* aq, HVector* ep,
                                     const HighsInt variable_in,
                                     const HighsInt row_out) {
  if (scale_ == NULL) return;
  // For (\hat)aq, UPDATE needs packValue and array[row_out] to
  // correspond to \bar{B}^{-1}(R.aq.cq), but CB.\bar{B}^{-1}(R.aq)
  // has been computed.
  //
  // Hence packValue and array[row_out] need to be scaled by cq;
  //
  // array[row_out] has to be unscaled by the corresponding entry of
  // CB
  //
  reportPackValue("pack aq Bf ", aq);
  double cq_scale_factor = variableScaleFactor(variable_in);

  for (HighsInt ix = 0; ix < aq->packCount; ix++)
    aq->packValue[ix] *= cq_scale_factor;
  reportPackValue("pack aq Af ", aq);
  //
  // Now focus on the pivot value, aq->array[row_out]
  double pivot_in_scaled_space = pivotInScaledSpace(aq, variable_in, row_out);
  // First scale by cq
  aq->array[row_out] *= cq_scale_factor;
  //
  // Also have to unscale by cp
  double cp_scale_factor = basicColScaleFactor(row_out);
  aq->array[row_out] /= cp_scale_factor;
  assert(pivot_in_scaled_space == aq->array[row_out]);
  // For (\hat)ep, UPDATE needs packValue to correspond to
  // \bar{B}^{-T}ep, but R.\bar{B}^{-T}(CB.ep) has been computed.
  //
  // Hence packValue needs to be unscaled by cp
  for (HighsInt ix = 0; ix < ep->packCount; ix++)
    ep->packValue[ix] /= cp_scale_factor;
}